

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O3

void __thiscall SID::write_state(SID *this,State *state)

{
  cycle_count cVar1;
  size_t in_RCX;
  undefined4 *puVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    write(this,(int)lVar3,(void *)(ulong)(uint)(int)state->sid_register[lVar3],in_RCX);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x19);
  cVar1 = state->bus_value_ttl;
  this->bus_value = state->bus_value;
  this->bus_value_ttl = cVar1;
  puVar2 = (undefined4 *)&this->field_0x84;
  lVar3 = -3;
  do {
    puVar2[-0x1c] = state->shift_register[lVar3];
    puVar2[-0x1b] = state->rate_counter[lVar3];
    puVar2[-0xb] = state->rate_counter_period[lVar3];
    puVar2[-10] = state->exponential_counter[lVar3];
    puVar2[-9] = state->exponential_counter_period[lVar3];
    puVar2[-8] = state->envelope_counter[lVar3];
    puVar2[-7] = state->envelope_state[lVar3];
    *puVar2 = *(undefined4 *)(state->hold_zero + lVar3 * 4);
    *(bool *)(puVar2 + -6) = state->hold_zero[lVar3 + 3];
    puVar2 = puVar2 + 0x24;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  return;
}

Assistant:

void SID::write_state(const State& state)
{
  int i;

  for (i = 0; i <= 0x18; i++) {
    write(i, state.sid_register[i]);
  }

  bus_value = state.bus_value;
  bus_value_ttl = state.bus_value_ttl;

  for (i = 0; i < 3; i++) {
    voice[i].wave.accumulator = state.accumulator[i];
    voice[i].wave.shift_register = state.shift_register[i];
    voice[i].envelope.rate_counter = state.rate_counter[i];
    voice[i].envelope.rate_period = state.rate_counter_period[i];
    voice[i].envelope.exponential_counter = state.exponential_counter[i];
    voice[i].envelope.exponential_counter_period = state.exponential_counter_period[i];
    voice[i].envelope.envelope_counter = state.envelope_counter[i];
    voice[i].envelope.state = state.envelope_state[i];
    voice[i].envelope.hold_zero = state.hold_zero[i];
  }
}